

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

TValue * lj_tab_setstr(lua_State *L,GCtab *t,GCstr *key)

{
  TValue *pTVar1;
  TValue k;
  cTValue local_8;
  
  pTVar1 = (TValue *)((ulong)(t->hmask & key->sid) * 0x18 + (t->node).ptr64);
  do {
    if ((GCstr *)(pTVar1[1].u64 & 0x7fffffffffff) == key &&
        (pTVar1[1].u64 & 0xffff800000000000) == 0xfffd800000000000) {
      return pTVar1;
    }
    pTVar1 = (TValue *)pTVar1[2].u64;
  } while (pTVar1 != (TValue *)0x0);
  local_8.u64 = (ulong)key | 0xfffd800000000000;
  pTVar1 = lj_tab_newkey(L,t,&local_8);
  return pTVar1;
}

Assistant:

TValue *lj_tab_setstr(lua_State *L, GCtab *t, const GCstr *key)
{
  TValue k;
  Node *n = hashstr(t, key);
  do {
    if (tvisstr(&n->key) && strV(&n->key) == key)
      return &n->val;
  } while ((n = nextnode(n)));
  setstrV(L, &k, key);
  return lj_tab_newkey(L, t, &k);
}